

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

int cmExecuteCommand(void *arg,char *name,int numArgs,char **args)

{
  char *pcVar1;
  bool bVar2;
  cmExecutionStatus local_f5;
  allocator local_f1;
  undefined1 local_f0 [3];
  cmExecutionStatus status;
  cmListFileArgument local_d0;
  int local_a0;
  int i;
  undefined1 local_90 [8];
  cmListFileFunction lff;
  cmMakefile *mf;
  char **args_local;
  int numArgs_local;
  char *name_local;
  void *arg_local;
  
  lff.Arguments.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)arg;
  cmListFileFunction::cmListFileFunction((cmListFileFunction *)local_90);
  std::__cxx11::string::operator=((string *)local_90,name);
  for (local_a0 = 0; local_a0 < numArgs; local_a0 = local_a0 + 1) {
    pcVar1 = args[local_a0];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_f0,pcVar1,&local_f1);
    cmListFileArgument::cmListFileArgument(&local_d0,(string *)local_f0,Quoted,0);
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
              ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
               &lff.super_cmListFileContext.Line,&local_d0);
    cmListFileArgument::~cmListFileArgument(&local_d0);
    std::__cxx11::string::~string((string *)local_f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  }
  cmExecutionStatus::cmExecutionStatus(&local_f5);
  bVar2 = cmMakefile::ExecuteCommand
                    ((cmMakefile *)
                     lff.Arguments.
                     super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     (cmListFileFunction *)local_90,&local_f5);
  cmListFileFunction::~cmListFileFunction((cmListFileFunction *)local_90);
  return (uint)bVar2;
}

Assistant:

int CCONV cmExecuteCommand(void *arg, const char *name,
                     int numArgs, const char **args)
{
  cmMakefile *mf = static_cast<cmMakefile *>(arg);
  cmListFileFunction lff;
  lff.Name = name;
  for(int i = 0; i < numArgs; ++i)
    {
    // Assume all arguments are quoted.
    lff.Arguments.push_back(
      cmListFileArgument(args[i], cmListFileArgument::Quoted, 0));
    }
  cmExecutionStatus status;
  return mf->ExecuteCommand(lff,status);
}